

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CovarianceMatrix.cpp
# Opt level: O0

void __thiscall CovarianceMatrix::loadFeatures(CovarianceMatrix *this)

{
  byte bVar1;
  bool bVar2;
  void *__s;
  istream *piVar3;
  char *pcVar4;
  value_type *__x;
  element_type *peVar5;
  long in_RDI;
  Feature f;
  int rootID;
  int categorical;
  int attributeID;
  string rootName;
  string typeOfFeature;
  string attrName;
  int featureNo;
  bool parsingSuccess;
  int degreeOfInteractions;
  int numOfFeatures;
  stringstream ssLine;
  string line;
  ifstream input;
  that_type that_9;
  that_type that_3;
  that_type that_6;
  that_type that;
  empty_env d;
  empty_state s;
  empty_env d_1;
  empty_state s_1;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>
  that_8;
  actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>
  that_2;
  type that_1;
  type that_7;
  expr_type that_4;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_5;
  expr_type that_10;
  size_t *in_stack_fffffffffffff088;
  undefined4 in_stack_fffffffffffff090;
  skip_flag in_stack_fffffffffffff094;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>
  *in_stack_fffffffffffff098;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::int_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::int_>_&,_const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_>_&>,_2L>_&>,_2L>
  *in_stack_fffffffffffff0a0;
  Feature *this_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff0a8;
  TreeDecomposition *this_01;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff0b0;
  string *this_02;
  undefined7 in_stack_fffffffffffff0b8;
  undefined1 in_stack_fffffffffffff0bf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer *__lhs;
  long alStack_de0 [100];
  string local_ac0 [32];
  string local_aa0 [32];
  string local_a80 [32];
  string local_a60 [32];
  string local_a40 [32];
  string local_a20 [36];
  int local_9fc;
  skip_flag local_9f8;
  int local_9f4;
  undefined1 local_9f0 [32];
  undefined1 local_9d0 [68];
  int local_98c;
  expr_type local_988;
  expr_type local_980 [2];
  pointer local_970;
  expr_type *local_968;
  expr_type local_960;
  __node_base local_958 [2];
  __node_base local_948;
  __node_base *local_940;
  __node_base *local_938;
  __buckets_ptr local_930;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_928;
  size_type local_918;
  size_t local_910;
  undefined1 local_901;
  undefined4 local_900;
  int local_8fc;
  size_t local_8f8 [2];
  ostream local_8e8 [376];
  string local_770 [32];
  string local_750 [48];
  size_t local_720 [66];
  undefined1 local_509;
  pointer *local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4f8;
  pointer *local_4f0;
  undefined1 local_4e1;
  char *local_4e0;
  __node_base *local_4d8;
  __node_base *local_4d0;
  char *local_4c8;
  undefined1 local_4b9;
  undefined1 *local_4b8;
  expr_type *peStack_4b0;
  expr_type *local_4a8;
  undefined1 *local_4a0;
  pointer local_498;
  expr_type *peStack_490;
  undefined1 local_479;
  undefined1 *local_478;
  __node_base *p_Stack_470;
  __node_base *local_468;
  undefined1 *local_460;
  _Hash_node_base *local_458;
  __node_base *p_Stack_450;
  undefined1 local_439;
  basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>_&,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>
  local_438;
  undefined1 *local_428;
  expr_type *local_420;
  int *local_418;
  undefined1 local_401;
  basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>_&,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>
  local_400;
  undefined1 *local_3f0;
  expr_type *local_3e8;
  int *local_3e0;
  undefined1 local_3c9;
  undefined1 *local_3c8;
  undefined1 local_3b9;
  undefined1 *local_3b8;
  undefined1 local_3ae;
  empty_env local_3ad;
  int local_3ac;
  expr_param local_3a8;
  undefined1 *local_3a0;
  int *local_398;
  undefined1 local_386;
  empty_env local_385;
  int local_384;
  expr_param local_380;
  undefined1 *local_378;
  int *local_370;
  undefined1 *local_360;
  undefined1 *local_358;
  undefined1 local_349;
  undefined1 *local_348;
  undefined1 *local_340;
  undefined1 local_333;
  impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>_&,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
  local_332;
  undefined1 local_331;
  data_param local_330;
  state_param local_328;
  expr_param local_320;
  undefined1 *local_318;
  int *local_310;
  impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>_&,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
  local_2fa;
  undefined1 local_2f9;
  data_param local_2f8;
  state_param local_2f0;
  expr_param local_2e8;
  undefined1 *local_2e0;
  int *local_2d8;
  undefined1 local_2c1;
  expr_type local_2c0 [2];
  undefined1 local_2a9;
  expr_param local_2a8;
  undefined1 *local_2a0;
  int *local_298;
  undefined1 local_281;
  expr_type local_280 [2];
  undefined1 local_269;
  expr_param local_268;
  undefined1 *local_260;
  int *local_258;
  expr_param local_248;
  expr_param local_240;
  expr_type *local_238;
  undefined1 *local_230;
  int *local_228;
  expr_type *local_218;
  undefined1 *local_210;
  int *local_208;
  expr_param local_1f8;
  undefined1 *local_1f0;
  int *local_1e8;
  expr_param local_1d8;
  undefined1 *local_1d0;
  int *local_1c8;
  expr_param local_1b8;
  int *local_1b0;
  undefined1 local_1a8;
  expr_param local_1a0;
  int *local_198;
  undefined1 local_190;
  undefined1 local_181;
  __node_base *local_180;
  undefined1 local_171;
  expr_type *local_170;
  undefined1 **local_168;
  undefined1 *local_160;
  undefined1 **local_158;
  undefined1 *local_150;
  expr_type *local_148;
  undefined1 *local_140;
  __node_base *local_138;
  undefined1 *local_130;
  undefined1 local_123;
  undefined1 local_122;
  undefined1 local_121;
  __node_base *local_120;
  char *pcStack_118;
  char *local_110;
  __node_base *local_108;
  undefined1 *local_100;
  __node_base *local_f8;
  char *pcStack_f0;
  __node_base *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  __node_base **local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  undefined8 local_98;
  undefined8 local_90;
  char *local_88;
  char *local_80;
  undefined1 local_73;
  undefined1 local_72;
  undefined1 local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  pointer *pppTStack_68;
  pointer *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  undefined1 *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  pointer *pppTStack_40;
  pointer *local_30;
  undefined1 *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  undefined1 *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_10;
  undefined1 *local_8;
  
  __s = operator_new__(800);
  memset(__s,0,800);
  *(void **)(in_RDI + 0xa8) = __s;
  std::ifstream::ifstream(local_720,(string *)multifaq::config::FEATURE_CONF_abi_cxx11_,_S_in);
  bVar1 = std::ios::operator!((ios *)((long)local_720 + *(long *)(local_720[0] - 0x18)));
  if ((bVar1 & 1) != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff0bf,in_stack_fffffffffffff0b8),
                   in_stack_fffffffffffff0b0._M_current);
    std::operator<<((ostream *)&std::cerr,local_750);
    std::__cxx11::string::~string(local_750);
    exit(1);
  }
  std::__cxx11::string::string(local_770);
  std::__cxx11::stringstream::stringstream((stringstream *)local_8f8);
  local_8fc = 0;
  local_900 = 0;
  do {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_720,local_770);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar2) break;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_770);
  } while ((*pcVar4 == '#') ||
          (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT44(in_stack_fffffffffffff094,in_stack_fffffffffffff090),
                                   (char *)in_stack_fffffffffffff088), bVar2));
  local_910 = std::__cxx11::string::begin();
  local_918 = std::__cxx11::string::end();
  local_960.child0.t_ = (proto_child0)boost::phoenix::ref<int>((int *)in_stack_fffffffffffff088);
  local_400.child0 = (proto_child0)&local_960;
  local_3f0 = &boost::spirit::_1;
  local_3c8 = &boost::spirit::_1;
  local_340 = &local_3c9;
  local_348 = &boost::spirit::_1;
  local_333 = 0;
  local_3a0 = &local_401;
  local_3a8 = &local_400;
  local_3ac = 0;
  local_2e0 = &local_3ae;
  local_2f0 = &local_3ac;
  local_2f8 = &local_3ad;
  local_3e8 = (expr_type *)local_400.child0;
  local_2e8 = local_3a8;
  local_2a8 = boost::proto::_::
              impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>_&,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
              ::operator()(&local_2fa,local_3a8,local_2f0,local_2f8);
  local_2a0 = &local_2f9;
  local_1d0 = &local_2c1;
  local_958[0]._M_nxt = (_Hash_node_base *)(local_2a8->child0->proto_expr_).child0.t_;
  local_1a8 = local_2a8->field_0x8;
  local_210 = &local_2a9;
  local_218 = local_2c0;
  local_460 = &boost::spirit::int_;
  local_940 = local_958;
  local_478 = &boost::spirit::int_;
  local_130 = &local_181;
  local_160 = &local_479;
  local_168 = &local_478;
  local_948._M_nxt = (_Hash_node_base *)&boost::spirit::int_;
  local_938 = &local_948;
  local_4e0 = ",";
  local_100 = &local_4e1;
  local_110 = ",";
  local_d8 = &local_121;
  local_c8 = &local_122;
  local_d0 = ",";
  local_a8 = ",";
  local_88 = ",";
  local_90 = 0;
  local_98 = 0;
  local_80 = ",";
  local_a0 = ",";
  local_c0 = ",";
  pcStack_118 = ",";
  local_b0 = &local_123;
  local_b8 = &local_120;
  local_930 = (__buckets_ptr)0x331c51;
  local_4d8 = local_938;
  local_4d0 = local_938;
  local_4c8 = (char *)local_930;
  local_468 = local_940;
  local_458 = local_948._M_nxt;
  p_Stack_450 = local_940;
  local_3e0 = (int *)local_958[0]._M_nxt;
  local_398 = (int *)local_958[0]._M_nxt;
  local_2d8 = (int *)local_958[0]._M_nxt;
  local_2c0[0].child0.t_ = (proto_child0)(proto_child0)local_958[0]._M_nxt;
  local_298 = (int *)local_958[0]._M_nxt;
  local_248 = local_2a8;
  local_208 = (int *)local_958[0]._M_nxt;
  local_1d8 = local_2a8;
  local_1c8 = (int *)local_958[0]._M_nxt;
  local_1b8 = local_2a8;
  local_1b0 = (int *)local_958[0]._M_nxt;
  local_180 = local_940;
  local_138 = local_940;
  local_120 = local_938;
  local_108 = local_938;
  local_f8 = local_938;
  pcStack_f0 = (char *)local_930;
  local_e0 = local_938;
  p_Stack_470 = local_940;
  local_988.child0.t_ = (proto_child0)boost::phoenix::ref<int>((int *)in_stack_fffffffffffff088);
  local_438.child0 = (proto_child0)&local_988;
  local_428 = &boost::spirit::_1;
  local_3b8 = &boost::spirit::_1;
  local_358 = &local_3b9;
  local_360 = &boost::spirit::_1;
  local_349 = 0;
  local_378 = &local_439;
  local_380 = &local_438;
  local_384 = 0;
  local_318 = &local_386;
  local_328 = &local_384;
  local_330 = &local_385;
  local_420 = (expr_type *)local_438.child0;
  local_320 = local_380;
  local_268 = boost::proto::_::
              impl<const_boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,_boost::proto::argsns_::list2<const_boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::reference_wrapper<int>_>,_0L>_>_&,_boost::phoenix::actor<boost::spirit::argument<0>_>_>,_2L>_&,_int,_boost::proto::envns_::empty_env>
              ::operator()(&local_332,local_380,local_328,local_330);
  local_260 = &local_331;
  local_1f0 = &local_281;
  local_980[0].child0.t_ = (proto_child0)(local_268->child0->proto_expr_).child0.t_;
  local_190 = local_268->field_0x8;
  local_230 = &local_269;
  local_238 = local_280;
  local_4a0 = &boost::spirit::int_;
  local_968 = local_980;
  local_4b8 = &boost::spirit::int_;
  local_140 = &local_171;
  local_150 = &local_4b9;
  local_158 = &local_4b8;
  local_970 = (pointer)&boost::spirit::int_;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_938;
  __lhs = &local_970;
  local_50 = &local_509;
  local_18 = &local_71;
  local_28 = &local_72;
  local_8 = &local_73;
  local_10 = &local_70;
  local_928._M_allocated_capacity = (size_type)__rhs;
  local_928._8_8_ = __lhs;
  local_508 = __lhs;
  local_500 = __rhs;
  local_4f8 = __rhs;
  local_4f0 = __lhs;
  local_4a8 = local_968;
  local_498 = local_970;
  peStack_490 = local_968;
  local_418 = (int *)local_980[0].child0.t_;
  local_370 = (int *)local_980[0].child0.t_;
  local_310 = (int *)local_980[0].child0.t_;
  local_280[0].child0.t_ = local_980[0].child0.t_;
  local_258 = (int *)local_980[0].child0.t_;
  local_240 = local_268;
  local_228 = (int *)local_980[0].child0.t_;
  local_1f8 = local_268;
  local_1e8 = (int *)local_980[0].child0.t_;
  local_1a0 = local_268;
  local_198 = (int *)local_980[0].child0.t_;
  local_170 = local_968;
  local_148 = local_968;
  local_70 = __rhs;
  pppTStack_68 = __lhs;
  local_60 = __lhs;
  local_58 = __rhs;
  local_48 = __rhs;
  pppTStack_40 = __lhs;
  local_30 = __lhs;
  local_20 = __rhs;
  peStack_4b0 = local_968;
  local_901 = boost::spirit::qi::
              phrase_parse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::int_>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<int>>,0l>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::int_>const&,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<int>>,0l>>,boost::phoenix::actor<boost::spirit::argument<0>>>,2l>>const&>,2l>const&>,2l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,boost::spirit::char_encoding::ascii>>,0l>>
                        (in_stack_fffffffffffff0a8,in_stack_fffffffffffff0b0,
                         in_stack_fffffffffffff0a0,in_stack_fffffffffffff098,
                         in_stack_fffffffffffff094);
  local_98c = 0;
  do {
    if (local_8fc <= local_98c) {
      std::__cxx11::stringstream::~stringstream((stringstream *)local_8f8);
      std::__cxx11::string::~string(local_770);
      std::ifstream::~ifstream(local_720);
      return;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)local_720,local_770);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_770);
    if ((*pcVar4 == '#') ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffff094,in_stack_fffffffffffff090),
                                (char *)in_stack_fffffffffffff088), bVar2)) {
      local_98c = local_98c + -1;
    }
    else {
      std::operator<<(local_8e8,local_770);
      this_02 = (string *)(local_9d0 + 0x20);
      std::__cxx11::string::string(this_02);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_8f8,this_02,':');
      this_01 = (TreeDecomposition *)local_9d0;
      std::__cxx11::string::string((string *)this_01);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_8f8,(string *)this_01,':');
      this_00 = (Feature *)local_9f0;
      std::__cxx11::string::string((string *)this_00);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)local_8f8,(string *)this_00,':');
      std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x24a6a3);
      __x = (value_type *)TreeDecomposition::getAttributeIndex(this_01,(string *)this_00);
      local_9f4 = (int)__x;
      in_stack_fffffffffffff094 =
           std::__cxx11::stoi((string *)
                              CONCAT44(in_stack_fffffffffffff094,in_stack_fffffffffffff090),
                              in_stack_fffffffffffff088,0);
      local_9f8 = in_stack_fffffffffffff094;
      std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x24a6fe);
      in_stack_fffffffffffff088 =
           (size_t *)TreeDecomposition::getRelationIndex(this_01,(string *)this_00);
      local_9fc = (int)in_stack_fffffffffffff088;
      if (local_9f4 == -1) {
        std::operator+((char *)__lhs,__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x,
                       (char *)CONCAT44(in_stack_fffffffffffff094,in_stack_fffffffffffff090));
        std::operator<<((ostream *)&std::cerr,local_a20);
        std::__cxx11::string::~string(local_a20);
        std::__cxx11::string::~string(local_a40);
        exit(1);
      }
      if (local_9fc == -1) {
        std::operator+((char *)__lhs,__rhs);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x,
                       (char *)CONCAT44(in_stack_fffffffffffff094,in_stack_fffffffffffff090));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff094,in_stack_fffffffffffff090));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__x,
                       (char *)CONCAT44(in_stack_fffffffffffff094,in_stack_fffffffffffff090));
        std::operator<<((ostream *)&std::cerr,local_a60);
        std::__cxx11::string::~string(local_a60);
        std::__cxx11::string::~string(local_a80);
        std::__cxx11::string::~string(local_aa0);
        std::__cxx11::string::~string(local_ac0);
        exit(1);
      }
      if ((local_98c == 0) && (local_9f8 == dont_postskip)) {
        std::operator<<((ostream *)&std::cerr,"The label needs to be continuous! ");
        exit(1);
      }
      std::bitset<100UL>::set(&this_00->head,(size_t)__x,SUB41(in_stack_fffffffffffff094 >> 0x18,0))
      ;
      std::bitset<100UL>::set(&this_00->head,(size_t)__x,SUB41(in_stack_fffffffffffff094 >> 0x18,0))
      ;
      Feature::Feature(this_00);
      if (local_9f8 == postskip) {
        peVar5 = std::
                 __shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x24aac7);
        *(size_t *)(*(long *)(in_RDI + 0xa8) + (long)local_9f4 * 8) = peVar5->_root->_id;
        alStack_de0[local_9f4] = alStack_de0[local_9f4] + 1;
      }
      else {
        std::bitset<100UL>::set
                  (&this_00->head,(size_t)__x,SUB41(in_stack_fffffffffffff094 >> 0x18,0));
        *(long *)(*(long *)(in_RDI + 0xa8) + (long)local_9f4 * 8) = (long)local_9fc;
        std::bitset<100UL>::set
                  (&this_00->head,(size_t)__x,SUB41(in_stack_fffffffffffff094 >> 0x18,0));
        std::bitset<100UL>::set
                  (&this_00->head,(size_t)__x,SUB41(in_stack_fffffffffffff094 >> 0x18,0));
      }
      std::vector<Feature,_std::allocator<Feature>_>::push_back
                ((vector<Feature,_std::allocator<Feature>_> *)this_00,__x);
      if (local_98c == 0) {
        *(long *)(in_RDI + 0xa0) = (long)local_9f4;
      }
      std::ios::clear((long)local_8f8 + *(long *)(local_8f8[0] - 0x18),0);
      std::__cxx11::string::~string((string *)local_9f0);
      std::__cxx11::string::~string((string *)local_9d0);
      std::__cxx11::string::~string((string *)(local_9d0 + 0x20));
    }
    local_98c = local_98c + 1;
  } while( true );
}

Assistant:

void CovarianceMatrix::loadFeatures()
{
    _queryRootIndex = new size_t[NUM_OF_VARIABLES]();
    
    /* Load the two-pass variables config file into an input stream. */
    ifstream input(FEATURE_CONF);

    if (!input)
    {
        ERROR(FEATURE_CONF +" does not exist. \n");
        exit(1);
    }

    /* String and associated stream to receive lines from the file. */
    string line;
    stringstream ssLine;

    int numOfFeatures = 0;
    int degreeOfInteractions = 0;
    
    /* Ignore comment and empty lines at the top */
    while (getline(input, line))
    {
        if (line[0] == COMMENT_CHAR || line == "")
            continue;

        break;
    }
    
    /* 
     * Extract number of labels, features and interactions from the config. 
     * Parse the line with the three numbers; ignore spaces. 
     */
    bool parsingSuccess =
        qi::phrase_parse(line.begin(), line.end(),

                         /* Begin Boost Spirit grammar. */
                         ((qi::int_[phoenix::ref(numOfFeatures) = qi::_1])
                          >> NUMBER_SEPARATOR_CHAR
                          >> (qi::int_[phoenix::ref(degreeOfInteractions) =
                                       qi::_1])),
                         /*  End grammar. */
                         ascii::space);

    assert(parsingSuccess && "The parsing of the features file has failed.");
    
    /* Read in the features. */
    for (int featureNo = 0; featureNo < numOfFeatures; ++featureNo)
    {
        getline(input, line);
        if (line[0] == COMMENT_CHAR || line == "")
        {
            --featureNo;
            continue;
        }

        ssLine << line;
 
        string attrName;
        /* Extract the name of the attribute in the current line. */
        getline(ssLine, attrName, ATTRIBUTE_NAME_CHAR);

        string typeOfFeature;
        /* Extract the dimension of the current attribute. */
        getline(ssLine, typeOfFeature, ATTRIBUTE_NAME_CHAR);

        string rootName;
        /* Extract the dimension of the current attribute. */
        getline(ssLine, rootName, ATTRIBUTE_NAME_CHAR);

        int attributeID = _td->getAttributeIndex(attrName);
        int categorical = stoi(typeOfFeature); 
        int rootID = _td->getRelationIndex(rootName);

        if (attributeID == -1)
        {
            ERROR("Attribute |"+attrName+"| does not exist.");
            exit(1);
        }

        if (rootID == -1)
        {
            ERROR("Relation |"+rootName+"| for "+attrName+" does not exist.");
            exit(1);
        }

        if (featureNo == 0 && categorical == 1)
        {
            ERROR("The label needs to be continuous! ");
            exit(1);
        }

        _isFeature.set(attributeID);
        _features.set(attributeID);

        Feature f;

        if (categorical)
        {
            _categoricalFeatures.set(attributeID);
            _queryRootIndex[attributeID] = rootID;

            f.head.set(attributeID);
            _isCategoricalFeature.set(attributeID);
        }
        else
        {
            _queryRootIndex[attributeID] = _td->_root->_id;
            ++f.body[attributeID];
        }

        _listOfFeatures.push_back(f);

        if (featureNo == 0)
            labelID = attributeID;
        
        /* Clear string stream. */
        ssLine.clear();
    }
}